

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

int fy_token_iter_utf8_get(fy_token_iter *iter)

{
  int local_24;
  uint local_20;
  int w1;
  int w;
  int c;
  fy_token_iter *iter_local;
  
  if (iter->unget_c == -1) {
    _w = iter;
    if ((iter->ic).str == (char *)0x0) {
      iter_local._4_4_ = fy_atom_iter_utf8_get(&iter->atom_iter);
    }
    else if ((iter->ic).len == 0) {
      iter_local._4_4_ = -1;
    }
    else {
      local_20 = fy_utf8_width_by_first_octet(*(iter->ic).str);
      if ((local_20 == 0) || ((_w->ic).len < (ulong)local_20)) {
        iter_local._4_4_ = -1;
      }
      else {
        iter_local._4_4_ = fy_utf8_get((_w->ic).str,local_20,&local_24);
        (_w->ic).str = (_w->ic).str + (int)local_20;
        (_w->ic).len = (_w->ic).len - (long)(int)local_20;
      }
    }
  }
  else {
    iter_local._4_4_ = iter->unget_c;
    iter->unget_c = -1;
  }
  return iter_local._4_4_;
}

Assistant:

int fy_token_iter_utf8_get(struct fy_token_iter *iter) {
    int c, w, w1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        return c;
    }

    /* direct */
    if (iter->ic.str) {

        /* not even 1 octet */
        if (!iter->ic.len)
            return -1;

        /* get width by the first octet */
        w = fy_utf8_width_by_first_octet((uint8_t) *iter->ic.str);
        if (!w || (unsigned int) w > iter->ic.len)
            return -1;

        /* get the next character */
        c = fy_utf8_get(iter->ic.str, w, &w1);

        iter->ic.str += w;
        iter->ic.len -= w;

        return c;
    }

    return fy_atom_iter_utf8_get(&iter->atom_iter);
}